

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
Imf_2_5::CompositeDeepScanLine::setFrameBuffer(CompositeDeepScanLine *this,FrameBuffer *fr)

{
  pointer pbVar1;
  int iVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  ConstIterator CVar5;
  char *pcVar6;
  iterator iVar7;
  Data *pDVar8;
  ConstIterator tmp;
  string name;
  int local_54;
  value_type local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->_Data->_channels,3);
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace((ulong)pbVar1,0,(char *)pbVar1->_M_string_length,0x5cdce3);
  pcVar6 = "ZBack";
  if (this->_Data->_zback == false) {
    pcVar6 = "Z";
  }
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pbVar1 + 1),0,(char *)pbVar1[1]._M_string_length,(ulong)pcVar6);
  pbVar1 = (this->_Data->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::_M_replace
            ((ulong)(pbVar1 + 2),0,(char *)pbVar1[2]._M_string_length,0xa9a43a);
  std::vector<int,_std::allocator<int>_>::resize(&this->_Data->_bufferMap,0);
  cVar3._M_node = (_Base_ptr)FrameBuffer::begin(fr);
  cVar4._M_node = (_Base_ptr)FrameBuffer::end(fr);
  if (cVar3._M_node != cVar4._M_node) {
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,(char *)(cVar3._M_node + 1),(allocator<char> *)&local_54);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar2 == 0) {
        pDVar8 = this->_Data;
        local_54 = 1;
        iVar7._M_current =
             (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&pDVar8->_bufferMap,iVar7,&local_54);
        }
        else {
          *iVar7._M_current = 1;
LAB_005a5a37:
          (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar2 == 0) {
          pDVar8 = this->_Data;
          local_54 = 0;
          iVar7._M_current =
               (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar7._M_current !=
              (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar7._M_current = 0;
            goto LAB_005a5a37;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&pDVar8->_bufferMap,iVar7,&local_54);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_50);
          pDVar8 = this->_Data;
          if (iVar2 == 0) {
            local_54 = 2;
            iVar7._M_current =
                 (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current !=
                (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar7._M_current = 2;
              goto LAB_005a5a37;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&pDVar8->_bufferMap,iVar7,&local_54);
          }
          else {
            local_54 = (int)((ulong)((long)(pDVar8->_channels).
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pDVar8->_channels).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
            iVar7._M_current =
                 (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&pDVar8->_bufferMap,iVar7,&local_54);
            }
            else {
              *iVar7._M_current = local_54;
              (pDVar8->_bufferMap).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->_Data->_channels,&local_50);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
      CVar5 = FrameBuffer::end(fr);
    } while ((const_iterator)cVar3._M_node != CVar5._i._M_node);
  }
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  ::operator=((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)&this->_Data->_outputFrameBuffer,
              (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
               *)fr);
  return;
}

Assistant:

void
CompositeDeepScanLine::setFrameBuffer(const FrameBuffer& fr)
{
    
    //
    // count channels; build map between channels in frame buffer
    // and channels in internal buffers
    //
    
    _Data->_channels.resize(3);
    _Data->_channels[0]="Z";
    _Data->_channels[1]=_Data->_zback ? "ZBack" : "Z";
    _Data->_channels[2]="A";
    _Data->_bufferMap.resize(0);
    
    for(FrameBuffer::ConstIterator q=fr.begin();q!=fr.end();q++)
    {
        string name(q.name());
        if(name=="ZBack")
        {
            _Data->_bufferMap.push_back(1);
        }else if(name=="Z")
        {
            _Data->_bufferMap.push_back(0);
        }else if(name=="A")
        {
            _Data->_bufferMap.push_back(2);
        }else{
            _Data->_bufferMap.push_back(_Data->_channels.size());
            _Data->_channels.push_back(name);
        }
    }
    
  _Data->_outputFrameBuffer=fr;
}